

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O3

int starma(int ip,int iq,double *phi,double *theta,double *A,double *P,double *V)

{
  size_t sVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  void *__s;
  void *__s_00;
  void *__dest;
  void *__s_01;
  long lVar9;
  void *pvVar10;
  long lVar11;
  double *pdVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  long lVar28;
  int iVar29;
  int iVar30;
  ulong uVar31;
  bool bVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  long local_a0;
  int local_48;
  int local_44;
  int local_3c;
  
  uVar25 = 2;
  if (-1 < iq) {
    uVar25 = (uint)ip >> 0x1f;
  }
  uVar6 = 4;
  if (iq * iq != 0 || ip * ip != 0) {
    uVar6 = uVar25;
  }
  uVar25 = iq + 1U;
  if ((int)(iq + 1U) <= ip) {
    uVar25 = ip;
  }
  uVar22 = (ulong)uVar25;
  uVar26 = 8;
  if (uVar25 != 1) {
    uVar26 = uVar6;
  }
  if (uVar26 == 0) {
    iVar18 = (uVar25 + 1) * uVar25;
    uVar6 = iVar18 / 2;
    uVar31 = (ulong)uVar6;
    iVar30 = (uVar6 - 1) * uVar6;
    iVar29 = iVar30 / 2;
    lVar8 = (long)(int)uVar6;
    sVar1 = lVar8 * 8;
    __s = malloc(sVar1);
    __s_00 = malloc(sVar1);
    __dest = malloc(sVar1);
    __s_01 = malloc((long)iVar29 << 3);
    if (1 < (int)uVar25) {
      uVar16 = 1;
      do {
        A[uVar16] = 0.0;
        if ((long)ip <= (long)uVar16) {
          phi[uVar16] = 0.0;
        }
        V[uVar16] = 0.0;
        if ((long)uVar16 <= (long)iq) {
          V[uVar16] = theta[uVar16 - 1];
        }
        uVar16 = uVar16 + 1;
      } while (uVar22 != uVar16);
    }
    *A = 0.0;
    if (ip == 0) {
      *phi = 0.0;
    }
    *V = 1.0;
    if (1 < (int)uVar25) {
      uVar17 = 1;
      uVar19 = uVar22;
      pdVar12 = V;
      uVar16 = uVar22;
      do {
        uVar16 = uVar16 - 1;
        pdVar12 = pdVar12 + 1;
        dVar34 = V[uVar17];
        uVar23 = 0;
        do {
          V[(long)(int)uVar19 + uVar23] = pdVar12[uVar23] * dVar34;
          uVar23 = uVar23 + 1;
        } while (uVar16 != uVar23);
        uVar19 = (ulong)(uint)((int)uVar19 + (int)uVar23);
        uVar17 = uVar17 + 1;
      } while (uVar17 != uVar22);
    }
    if (ip == 0) {
      if (-1 < iq) {
        uVar22 = uVar31;
        uVar6 = 1;
        do {
          lVar8 = (long)(int)uVar22;
          uVar7 = 0;
          do {
            lVar8 = lVar8 + -1;
            dVar34 = V[lVar8];
            P[lVar8] = dVar34;
            if (uVar7 != 0) {
              iVar18 = (int)uVar31;
              uVar31 = (ulong)(iVar18 - 1);
              P[lVar8] = dVar34 + P[(long)iVar18 + -1];
            }
            uVar7 = uVar7 + 1;
          } while (uVar6 != uVar7);
          uVar22 = (ulong)((int)uVar22 - uVar7);
          bVar32 = uVar6 != uVar25;
          uVar6 = uVar6 + 1;
        } while (bVar32);
      }
    }
    else {
      if (1 < iVar30) {
        memset(__s_01,0,(ulong)(iVar29 - 1) * 8 + 8);
      }
      uVar16 = (ulong)(uVar6 - 1);
      if (1 < iVar18) {
        sVar1 = uVar16 * 8 + 8;
        memset(P,0,sVar1);
        memset(__s_00,0,sVar1);
        memset(__s,0,sVar1);
      }
      uVar7 = uVar6 - uVar25;
      lVar9 = (long)(int)uVar7;
      if (0 < (int)uVar25) {
        iVar30 = uVar7 - 1;
        uVar17 = (ulong)(uVar25 - 1);
        local_3c = -1;
        uVar23 = 0;
        local_44 = 0;
        uVar19 = uVar22;
        local_a0 = lVar9;
        do {
          dVar34 = phi[uVar23];
          *(undefined8 *)((long)__s + local_a0 * 8) = 0;
          local_a0 = local_a0 + 1;
          lVar28 = (long)local_44;
          local_44 = (int)uVar19 + local_44;
          local_48 = uVar7 + 1 + (int)uVar23;
          uVar27 = uVar23;
          do {
            dVar33 = phi[uVar27];
            if ((uVar23 != uVar17) &&
               (*(double *)((long)__s + local_a0 * 8) = -dVar33, uVar27 != uVar17)) {
              *(double *)((long)__s + (long)local_48 * 8) =
                   *(double *)((long)__s + (long)local_48 * 8) - dVar34;
              lVar11 = (long)local_3c;
              local_3c = local_3c + 1;
              *(undefined8 *)((long)__s + lVar11 * 8 + 8) = 0xbff0000000000000;
            }
            dVar37 = V[lVar28];
            iVar30 = iVar30 + 1;
            if ((int)uVar6 <= iVar30) {
              iVar30 = 0;
            }
            *(double *)((long)__s + lVar9 * 8) = -dVar33 * dVar34;
            lVar11 = (long)iVar30;
            *(double *)((long)__s + lVar11 * 8) = *(double *)((long)__s + lVar11 * 8) + 1.0;
            dVar33 = 1.0;
            if (1 < iVar18) {
              memcpy(__dest,__s,uVar31 * 8);
              uVar20 = 0;
              iVar15 = 0;
              dVar33 = 1.0;
              pvVar10 = __dest;
              uVar14 = uVar31;
              do {
                uVar14 = uVar14 - 1;
                pvVar10 = (void *)((long)pvVar10 + 8);
                dVar2 = *(double *)((long)__dest + uVar20 * 8);
                if ((dVar2 != 0.0) || (NAN(dVar2))) {
                  dVar3 = P[uVar20];
                  dVar36 = dVar33 * dVar2 * dVar2 + dVar3;
                  P[uVar20] = dVar36;
                  dVar35 = dVar3 / dVar36;
                  dVar36 = (dVar33 * dVar2) / dVar36;
                  if (uVar20 + 1 < uVar31 && uVar20 != uVar16) {
                    uVar24 = 0;
                    do {
                      dVar4 = *(double *)((long)pvVar10 + uVar24 * 8);
                      dVar5 = *(double *)((long)__s_01 + uVar24 * 8 + (long)iVar15 * 8);
                      *(double *)((long)pvVar10 + uVar24 * 8) = -dVar2 * dVar5 + dVar4;
                      *(double *)((long)__s_01 + uVar24 * 8 + (long)iVar15 * 8) =
                           dVar5 * dVar35 + dVar4 * dVar36;
                      uVar24 = uVar24 + 1;
                    } while (uVar14 != uVar24);
                    iVar15 = iVar15 + (int)uVar24;
                  }
                  dVar4 = *(double *)((long)__s_00 + uVar20 * 8);
                  *(double *)((long)__s_00 + uVar20 * 8) = dVar35 * dVar4 + dVar36 * dVar37;
                  if ((dVar3 == 0.0) && (!NAN(dVar3))) goto LAB_00112629;
                  dVar33 = dVar33 * dVar35;
                  dVar37 = dVar37 + -dVar2 * dVar4;
                }
                else {
                  iVar15 = iVar15 + ~(uint)uVar20 + uVar6;
                }
                uVar20 = uVar20 + 1;
              } while (uVar20 != uVar31);
            }
            if (dVar33 < 0.0) {
              sqrt(dVar33);
            }
LAB_00112629:
            *(undefined8 *)((long)__s + lVar11 * 8) = 0;
            if (uVar27 != uVar17) {
              *(undefined8 *)((long)__s + (long)local_48 * 8) = 0;
              local_48 = local_48 + 1;
              *(undefined8 *)((long)__s + (long)local_3c * 8) = 0;
            }
            lVar28 = lVar28 + 1;
            uVar27 = uVar27 + 1;
          } while (local_44 != (int)lVar28);
          uVar23 = uVar23 + 1;
          uVar19 = (ulong)((int)uVar19 - 1);
        } while (uVar23 != uVar22);
      }
      if (1 < iVar18) {
        iVar29 = iVar29 + -1;
        lVar28 = uVar31 * 8;
        uVar13 = 0;
        do {
          uVar31 = uVar31 - 1;
          dVar34 = *(double *)((long)__s_00 + uVar31 * 8);
          if (uVar13 != 0 && uVar31 != uVar16) {
            lVar11 = 0;
            uVar21 = 0;
            do {
              dVar34 = dVar34 - *(double *)((long)__s_01 + lVar11 + (long)iVar29 * 8) *
                                *(double *)((long)P + lVar11 + lVar28 + -8);
              uVar21 = uVar21 + 1;
              lVar11 = lVar11 + -8;
            } while (uVar13 != uVar21);
            iVar29 = iVar29 - uVar21;
          }
          P[uVar31] = dVar34;
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar6);
      }
      if (0 < (int)uVar25) {
        memcpy(__s,P + lVar9,uVar22 * 8);
      }
      if (0 < (int)uVar7) {
        pdVar12 = P + ((ulong)uVar7 - 1);
        lVar9 = (long)iq + 1;
        if ((long)iq + 1 <= (long)ip) {
          lVar9 = (long)ip;
        }
        do {
          P[lVar8 + -1] = *pdVar12;
          lVar8 = lVar8 + -1;
          pdVar12 = pdVar12 + -1;
        } while ((int)lVar9 != (int)lVar8);
      }
      if (0 < (int)uVar25) {
        memcpy(P,__s,uVar22 << 3);
      }
    }
    free(__s);
    free(__s_00);
    free(__dest);
    free(__s_01);
  }
  return uVar26;
}

Assistant:

int starma(int ip, int iq,double *phi,double *theta,double *A,double *P,double *V) {
	int ifault,ir,np,nrbar,i,ind,j,ir1,irank,ifail;
	int npr, npr1, ind1, ind2, indj,indi,indn;
	double vj,ssqerr,phij,phii,ynext,weight,recres;
	double *thetab, *xnext, *xrow, *rbar;
	ifault = 0;
	/*
	c   algorithm as 154 appl. statist. (1980) vol.29, no.3
	c
	c   invoking this subroutine sets the values of v and phi, and obtains
	c   the initial values of a and p.
	c   this routine is not suitable for use with an ar(1) process.
	c   in this case the following instructions should be used for
	c   initialisation.
	c          v(1)=1.0
	c          a(1)=0.0
	c          p(1)=1.0/(1.0-phi(1)*phi(1))
	c
	*/

	// Check for input errors

	if (ip < 0) {
		ifault = 1;
	}
	if (iq < 0) {
		ifault = 2;
	}

	if (ip*ip + iq*iq == 0) {
		ifault = 4;
	}

	ir = iq + 1;

	if (ir < ip) {
		ir = ip;
	}

	np = (ir * (ir + 1)) / 2;
	nrbar = (np * (np - 1)) / 2;

	if (ir == 1) {
		ifault = 8;
	}
	
	if (ifault != 0) {
		return ifault;
	}

	xnext = (double*)malloc(sizeof(double)* np);
	thetab = (double*)malloc(sizeof(double)* np);
	xrow = (double*)malloc(sizeof(double)* np);
	rbar = (double*)malloc(sizeof(double)* nrbar);

	for (i = 1; i < ir;++i) {
		A[i] = 0.0;
		if (i >= ip) {
			phi[i] = 0.0;
		}
		V[i] = 0.0;
		if (i < iq+1) {
			V[i] = theta[i - 1];
		}
	}

	A[0] = 0.0;
	if (ip == 0) {
		phi[0] = 0.0;
	}
	V[0] = 1.0;
	ind = ir;

	for (j = 1; j < ir; ++j) {
		vj = V[j];
		for (i = j; i < ir; ++i) {
			V[ind] = V[i] * vj;
			ind++;
		}
	}

	if (ip != 0) {//300
		/*
		c   now find p(0).

c   the set of equations s*vec(p(0))=vec(v) is solved for vec(p(0)).
c   s is generated row by row in the array xnext.
c   the order of elements in p is changed, so as to bring more leading
c   zeros into the rows of s, hence achieving a reduction of computing
c   time.
		*/
		ir1 = ir - 1;
		irank = 0;
		ifail = 0;
		ssqerr = 0.0;

		for (i = 0; i < nrbar; ++i) {
			rbar[i] = 0.0;
		}
		for (i = 0; i < np; ++i) {
			P[i] = 0.0;
			thetab[i] = 0.0;
			xnext[i] = 0.0;
		}
		ind = 0;
		ind1 = -1;
		npr = np - ir;
		npr1 = npr + 1;
		indj = npr;
		ind2 = npr-1;

		for (j = 0; j < ir; ++j) {//110
			phij = phi[j];
			xnext[indj] = 0.0;
			indj = indj + 1;
			indi = npr1 + j;

			for (i = j; i < ir; ++i) {//110
				ynext = V[ind];
				ind++;
				phii = phi[i];
				if (j != (ir - 1)) {
					xnext[indj] = -phii;
					if (i != (ir - 1)) {
						xnext[indi] -= phij;
						ind1 ++;
						xnext[ind1] = -1.0;
					}
				}//100
				xnext[npr] = -phii*phij;
				ind2++;
				if (ind2 >= np) {
					ind2 = 0;
				}
				xnext[ind2] += 1.0;
				weight = 1.0;
				ifail = inclu2(np, nrbar, weight, xnext, xrow, ynext, P, rbar, thetab, &ssqerr, &recres, &irank);
				//mdisplay(P, 1, np);
				xnext[ind2] = 0.0;
				if (i != (ir - 1)) {
					xnext[indi] = 0.0;
					indi++;
					xnext[ind1] = 0.0;
				}
			}//110
		}//110
		//mdisplay(P, 1, np);
		regres(np, nrbar, rbar, thetab, P);
		/*
		Now Re-order P
		*/
		ind = npr;
		for (i = 0; i < ir; ++i) {
			ind++;
			xnext[i] = P[ind - 1];
		}
		ind = np;
		ind1 = npr;

		for (i = 0; i < npr; ++i) {
			P[ind - 1] = P[ind1 - 1];
			ind--;
			ind1--;
		}

		for (i = 0; i < ir; ++i) {
			P[i] = xnext[i];
		}
		//return ifault;
	}
	else {

		// P[0] is obtained by back-substitution for a Moving Average process

		indn = np;
		ind = np;
		for (i = 0; i < ir; i++) {
			for (j = 0; j <= i; j++) {
				ind--;
				P[ind] = V[ind];
				if (j != 0)  {
					indn--;
					P[ind] += P[indn];
				}
			}
		}
	}

	free(xnext);
	free(thetab);
	free(xrow);
	free(rbar);
	return ifault;
}